

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_remove(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *local_50;
  TValue *p;
  int idx_local;
  lua_State *L_local;
  
  local_50 = index2adr_stack(L,idx);
  while (pTVar1 = local_50 + 1, pTVar1 < L->top) {
    *local_50 = *pTVar1;
    local_50 = pTVar1;
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_remove(lua_State *L, int idx)
{
  TValue *p = index2adr_stack(L, idx);
  while (++p < L->top) copyTV(L, p-1, p);
  L->top--;
}